

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool compare_files(char *pFilename1,char *pFilename2)

{
  int iVar1;
  reference pvVar2;
  size_t sVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint bytes_to_read;
  int64 bytes_remaining;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf1;
  uint cBufSize;
  int64 fileSize2;
  int64 fileSize1;
  FILE *pFile2;
  FILE *pFile1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ulong local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_89 [3];
  undefined4 local_3c;
  ulong local_38;
  ulong local_30;
  FILE *local_28;
  FILE *local_20;
  undefined8 local_18;
  undefined8 local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = (FILE *)open_file_with_retries
                               (in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
  if (local_20 == (FILE *)0x0) {
    print_error("Failed opening file: %s\n",local_10);
    local_1 = 0;
  }
  else {
    local_28 = (FILE *)open_file_with_retries
                                 (in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    if (local_28 == (FILE *)0x0) {
      print_error("Failed opening file: %s\n",local_18);
      fclose(local_20);
      local_1 = 0;
    }
    else {
      fseek(local_20,0,2);
      local_30 = ftello64(local_20);
      fseek(local_20,0,0);
      fseek(local_28,0,2);
      local_38 = ftello64(local_28);
      fseek(local_28,0,0);
      if (local_30 == local_38) {
        local_3c = 0x100000;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x112f15);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x112f38);
        this = local_89;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x112f47);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (this,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x112f67);
        for (local_98 = local_30; local_98 != 0; local_98 = local_98 - (uVar4 & 0xffffffff)) {
          uVar4 = local_98;
          if (0x100000 < (long)local_98) {
            uVar4 = 0x100000;
          }
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                             (in_stack_ffffffffffffff30);
          in_stack_ffffffffffffff40 = (allocator_type *)fread(pvVar2,uVar4 & 0xffffffff,1,local_20);
          if (in_stack_ffffffffffffff40 != (allocator_type *)0x1) {
            print_error("Failed reading from file: %s\n",local_10);
            fclose(local_20);
            fclose(local_28);
            local_1 = 0;
            goto LAB_001131c1;
          }
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                             (in_stack_ffffffffffffff30);
          sVar3 = fread(pvVar2,uVar4 & 0xffffffff,1,local_28);
          if (sVar3 != 1) {
            print_error("Failed reading from file: %s\n",local_18);
            fclose(local_20);
            fclose(local_28);
            local_1 = 0;
            goto LAB_001131c1;
          }
          in_stack_ffffffffffffff30 =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                         (in_stack_ffffffffffffff30);
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                             (in_stack_ffffffffffffff30);
          iVar1 = memcmp(in_stack_ffffffffffffff30,pvVar2,uVar4 & 0xffffffff);
          if (iVar1 != 0) {
            print_error("File data comparison failed!\n");
            fclose(local_20);
            fclose(local_28);
            local_1 = 0;
            goto LAB_001131c1;
          }
        }
        fclose(local_20);
        fclose(local_28);
        local_1 = 1;
LAB_001131c1:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff40);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff40);
      }
      else {
        print_error("Files to compare are not the same size: %I64i vs. %I64i.\n",local_30,local_38);
        fclose(local_20);
        fclose(local_28);
        local_1 = 0;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool compare_files(const char *pFilename1, const char* pFilename2)
{
   FILE* pFile1 = open_file_with_retries(pFilename1, "rb");
   if (!pFile1)
   {
      print_error("Failed opening file: %s\n", pFilename1);
      return false;
   }

   FILE* pFile2 = open_file_with_retries(pFilename2, "rb");
   if (!pFile2)
   {
      print_error("Failed opening file: %s\n", pFilename2);
      fclose(pFile1);
      return false;
   }

   fseek(pFile1, 0, SEEK_END);
   int64 fileSize1 = _ftelli64(pFile1);
   fseek(pFile1, 0, SEEK_SET);

   fseek(pFile2, 0, SEEK_END);
   int64 fileSize2 = _ftelli64(pFile2);
   fseek(pFile2, 0, SEEK_SET);

   if (fileSize1 != fileSize2)
   {
      print_error("Files to compare are not the same size: %I64i vs. %I64i.\n", fileSize1, fileSize2);
      fclose(pFile1);
      fclose(pFile2);
      return false;
   }

   const uint cBufSize = 1024 * 1024;
   std::vector<uint8> buf1(cBufSize);
   std::vector<uint8> buf2(cBufSize);

   int64 bytes_remaining = fileSize1;
   while (bytes_remaining)
   {
      const uint bytes_to_read = static_cast<uint>(my_min(cBufSize, bytes_remaining));

      if (fread(&buf1.front(), bytes_to_read, 1, pFile1) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename1);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (fread(&buf2.front(), bytes_to_read, 1, pFile2) != 1)
      {
         print_error("Failed reading from file: %s\n", pFilename2);
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      if (memcmp(&buf1.front(), &buf2.front(), bytes_to_read) != 0)
      {
         print_error("File data comparison failed!\n");
         fclose(pFile1);
         fclose(pFile2);
         return false;
      }

      bytes_remaining -= bytes_to_read;
   }

   fclose(pFile1);
   fclose(pFile2);
   return true;
}